

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O1

_Bool av1_compute_corner_list
                (YV12_BUFFER_CONFIG *frame,int bit_depth,int downsample_level,CornerList *corners)

{
  ImagePyramid *pyr;
  PyramidLayer *pPVar1;
  int iVar2;
  xy *__ptr;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  bool bVar9;
  _Bool _Var10;
  int *scores;
  int num_corners;
  int *local_438;
  uint local_42c;
  int local_428 [256];
  
  pthread_mutex_lock((pthread_mutex_t *)corners);
  if (corners->valid == false) {
    pyr = frame->y_pyramid;
    iVar2 = aom_compute_pyramid(frame,bit_depth,downsample_level + 1,pyr);
    if (iVar2 < 0) {
      _Var10 = false;
    }
    else {
      iVar2 = iVar2 + -1;
      pPVar1 = pyr->layers;
      local_438 = (int *)0x0;
      __ptr = aom_fast9_detect_nonmax
                        (pPVar1[iVar2].buffer,pPVar1[iVar2].width,pPVar1[iVar2].height,
                         pPVar1[iVar2].stride,0x12,&local_438,(int *)&local_42c);
      lVar8 = (long)(int)local_42c;
      if (-1 < lVar8) {
        bVar4 = (byte)iVar2;
        if ((int)local_42c < 0x1001) {
          if (local_42c != 0) {
            lVar3 = 0;
            do {
              corners->corners[lVar3 * 2] = __ptr[lVar3].x << (bVar4 & 0x1f);
              corners->corners[lVar3 * 2 + 1] = __ptr[lVar3].y << (bVar4 & 0x1f);
              lVar3 = lVar3 + 1;
            } while (lVar8 != lVar3);
          }
          corners->num_corners = local_42c;
        }
        else {
          lVar3 = 0;
          memset(local_428,0,0x400);
          do {
            local_428[local_438[lVar3]] = local_428[local_438[lVar3]] + 1;
            lVar3 = lVar3 + 1;
          } while (lVar8 != lVar3);
          iVar2 = 0;
          uVar5 = 0xff;
          do {
            iVar2 = iVar2 + local_428[uVar5];
            if (0x1000 < iVar2) goto LAB_0029bb29;
            bVar9 = uVar5 != 0;
            uVar5 = uVar5 - 1;
          } while (bVar9);
          uVar5 = 0xffffffff;
LAB_0029bb29:
          uVar6 = 1;
          if (1 < (int)local_42c) {
            uVar6 = (ulong)local_42c;
          }
          uVar7 = 0;
          iVar2 = 0;
          do {
            if ((int)uVar5 < local_438[uVar7]) {
              corners->corners[iVar2 * 2] = __ptr[uVar7].x << (bVar4 & 0x1f);
              corners->corners[iVar2 * 2 + 1] = __ptr[uVar7].y << (bVar4 & 0x1f);
              iVar2 = iVar2 + 1;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          corners->num_corners = iVar2;
        }
        free(local_438);
        free(__ptr);
      }
      _Var10 = -1 < (int)local_42c;
    }
    corners->valid = _Var10;
  }
  _Var10 = corners->valid;
  pthread_mutex_unlock((pthread_mutex_t *)corners);
  return _Var10;
}

Assistant:

bool av1_compute_corner_list(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                             int downsample_level, CornerList *corners) {
  assert(corners);

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD

  if (!corners->valid) {
    corners->valid =
        compute_corner_list(frame, bit_depth, downsample_level, corners);
  }
  bool valid = corners->valid;

#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  return valid;
}